

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O1

arith_uint256 * UintToArith256(arith_uint256 *__return_storage_ptr__,uint256 *a)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar1 = *(undefined8 *)(a->super_base_blob<256U>).m_data._M_elems;
    uVar2 = *(undefined8 *)((a->super_base_blob<256U>).m_data._M_elems + 8);
    uVar3 = *(undefined8 *)((a->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 4) =
         *(undefined8 *)((a->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 6) = uVar3;
    *(undefined8 *)(__return_storage_ptr__->super_base_uint<256U>).pn = uVar1;
    *(undefined8 *)((__return_storage_ptr__->super_base_uint<256U>).pn + 2) = uVar2;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 UintToArith256(const uint256 &a)
{
    arith_uint256 b;
    for(int x=0; x<b.WIDTH; ++x)
        b.pn[x] = ReadLE32(a.begin() + x*4);
    return b;
}